

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O3

void __thiscall PiecewiseConstant2D_Integral_Test::TestBody(PiecewiseConstant2D_Integral_Test *this)

{
  pointer pfVar1;
  bool bVar2;
  Allocator AVar3;
  long lVar4;
  char *pcVar5;
  initializer_list<float> __l;
  span<const_float> func;
  span<const_float> func_00;
  span<const_float> func_01;
  span<const_float> func_02;
  Bounds2f domain;
  AssertionResult gtest_ar_3;
  vector<float,_std::allocator<float>_> values;
  PiecewiseConstant2D dist4;
  PiecewiseConstant2D dist3;
  PiecewiseConstant2D dist2;
  PiecewiseConstant2D dist;
  AssertHelper local_250;
  AssertHelper local_248;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_240;
  AssertHelper local_238;
  vector<float,_std::allocator<float>_> local_230;
  PiecewiseConstant2D local_218;
  PiecewiseConstant2D local_198;
  PiecewiseConstant2D local_118;
  PiecewiseConstant2D local_98;
  
  local_98.domain.pMin.super_Tuple2<pbrt::Point2,_float>.x = 1.0;
  local_98.domain.pMin.super_Tuple2<pbrt::Point2,_float>.y = 2.0;
  local_98.domain.pMax.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
  local_98.domain.pMax.super_Tuple2<pbrt::Point2,_float>.y = 7.0;
  local_98.pConditionalV.alloc.memoryResource = (memory_resource *)0x3f80000040400000;
  local_98.pConditionalV.ptr = (PiecewiseConstant1D *)0x40000000;
  __l._M_len = 8;
  __l._M_array = (iterator)&local_98;
  std::vector<float,_std::allocator<float>_>::vector(&local_230,__l,(allocator_type *)&local_118);
  pfVar1 = local_230.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)local_230.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_230.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  AVar3.memoryResource = pstd::pmr::new_delete_resource();
  func.n = lVar4 >> 2;
  func.ptr = pfVar1;
  pbrt::PiecewiseConstant2D::PiecewiseConstant2D
            (&local_98,func,4,2,(Bounds2f)(ZEXT816(0x3f8000003f800000) << 0x40),AVar3);
  local_198.domain.pMin.super_Tuple2<pbrt::Point2,_float>.x = 2.8026e-45;
  local_218.domain.pMin.super_Tuple2<pbrt::Point2,_float>.x = local_98.pMarginal.funcInt;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&local_118,"2","dist.Integral()",(int *)&local_198,(float *)&local_218);
  if (local_118.domain.pMin.super_Tuple2<pbrt::Point2,_float>.x._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_198);
    if (local_118.domain.pMax.super_Tuple2<pbrt::Point2,_float> == (Tuple2<pbrt::Point2,_float>)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_118.domain.pMax.super_Tuple2<pbrt::Point2,_float>;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x1af,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_218,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
    if (CONCAT44(local_198.domain.pMin.super_Tuple2<pbrt::Point2,_float>.y,
                 local_198.domain.pMin.super_Tuple2<pbrt::Point2,_float>.x) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_198.domain.pMin.super_Tuple2<pbrt::Point2,_float>.y,
                           local_198.domain.pMin.super_Tuple2<pbrt::Point2,_float>.x) != (long *)0x0
         )) {
        (**(code **)(*(long *)CONCAT44(local_198.domain.pMin.super_Tuple2<pbrt::Point2,_float>.y,
                                       local_198.domain.pMin.super_Tuple2<pbrt::Point2,_float>.x) +
                    8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_118.domain.pMax,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pfVar1 = local_230.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)local_230.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_230.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  AVar3.memoryResource = pstd::pmr::new_delete_resource();
  func_00.n = lVar4 >> 2;
  func_00.ptr = pfVar1;
  pbrt::PiecewiseConstant2D::PiecewiseConstant2D
            (&local_118,func_00,2,4,(Bounds2f)(ZEXT816(0x3f8000003f800000) << 0x40),AVar3);
  local_218.domain.pMin.super_Tuple2<pbrt::Point2,_float>.x = 2.8026e-45;
  local_248.data_._0_4_ = local_118.pMarginal.funcInt;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&local_198,"2","dist2.Integral()",(int *)&local_218,(float *)&local_248);
  if (local_198.domain.pMin.super_Tuple2<pbrt::Point2,_float>.x._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_218);
    if (local_198.domain.pMax.super_Tuple2<pbrt::Point2,_float> == (Tuple2<pbrt::Point2,_float>)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_198.domain.pMax.super_Tuple2<pbrt::Point2,_float>;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x1b2,pcVar5);
    testing::internal::AssertHelper::operator=(&local_248,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_248);
    if (CONCAT44(local_218.domain.pMin.super_Tuple2<pbrt::Point2,_float>.y,
                 local_218.domain.pMin.super_Tuple2<pbrt::Point2,_float>.x) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_218.domain.pMin.super_Tuple2<pbrt::Point2,_float>.y,
                           local_218.domain.pMin.super_Tuple2<pbrt::Point2,_float>.x) != (long *)0x0
         )) {
        (**(code **)(*(long *)CONCAT44(local_218.domain.pMin.super_Tuple2<pbrt::Point2,_float>.y,
                                       local_218.domain.pMin.super_Tuple2<pbrt::Point2,_float>.x) +
                    8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_198.domain.pMax,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pfVar1 = local_230.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)local_230.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_230.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  AVar3.memoryResource = pstd::pmr::new_delete_resource();
  func_01.n = lVar4 >> 2;
  func_01.ptr = pfVar1;
  pbrt::PiecewiseConstant2D::PiecewiseConstant2D
            (&local_198,func_01,4,2,(Bounds2f)(ZEXT816(0x4000000040800000) << 0x40),AVar3);
  local_248.data_._0_4_ = 2.24208e-44;
  local_250.data_._0_4_ = local_198.pMarginal.funcInt;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&local_218,"16","dist3.Integral()",(int *)&local_248,(float *)&local_250);
  if (local_218.domain.pMin.super_Tuple2<pbrt::Point2,_float>.x._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_248);
    if (local_218.domain.pMax.super_Tuple2<pbrt::Point2,_float> == (Tuple2<pbrt::Point2,_float>)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_218.domain.pMax.super_Tuple2<pbrt::Point2,_float>;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x1b5,pcVar5);
    testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if (CONCAT44(local_248.data_._4_4_,local_248.data_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(local_248.data_._4_4_,local_248.data_._0_4_) != (long *)0x0))
      {
        (**(code **)(*(long *)CONCAT44(local_248.data_._4_4_,local_248.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_218.domain.pMax,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pfVar1 = local_230.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)local_230.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_230.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  AVar3.memoryResource = pstd::pmr::new_delete_resource();
  func_02.n = lVar4 >> 2;
  func_02.ptr = pfVar1;
  domain.pMin.super_Tuple2<pbrt::Point2,_float> = SUB648(ZEXT464(0xbf800000),0);
  domain.pMax.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
  domain.pMax.super_Tuple2<pbrt::Point2,_float>.y = 4.0;
  pbrt::PiecewiseConstant2D::PiecewiseConstant2D(&local_218,func_02,4,2,domain,AVar3);
  local_250.data_._0_4_ = 1.12104e-44;
  local_238.data_._0_4_ = local_218.pMarginal.funcInt;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&local_248,"8","dist4.Integral()",(int *)&local_250,(float *)&local_238);
  if (local_248.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_250);
    if (local_240.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_240.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x1b8,pcVar5);
    testing::internal::AssertHelper::operator=(&local_238,(Message *)&local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    if (CONCAT44(local_250.data_._4_4_,local_250.data_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(local_250.data_._4_4_,local_250.data_._0_4_) != (long *)0x0))
      {
        (**(code **)(*(long *)CONCAT44(local_250.data_._4_4_,local_250.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_240,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_218.pMarginal.cdf);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_218.pMarginal.func);
  pstd::
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
  ~vector(&local_218.pConditionalV);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_198.pMarginal.cdf);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_198.pMarginal.func);
  pstd::
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
  ~vector(&local_198.pConditionalV);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_118.pMarginal.cdf);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_118.pMarginal.func);
  pstd::
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
  ~vector(&local_118.pConditionalV);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_98.pMarginal.cdf);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_98.pMarginal.func);
  pstd::
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
  ~vector(&local_98.pConditionalV);
  if (local_230.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_230.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_230.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_230.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(PiecewiseConstant2D, Integral) {
    std::vector<Float> values{Float(1), Float(2), Float(0), Float(7),
                              Float(3), Float(1), Float(2), Float(0)};

    PiecewiseConstant2D dist(values, 4, 2);
    EXPECT_EQ(2, dist.Integral());

    PiecewiseConstant2D dist2(values, 2, 4);
    EXPECT_EQ(2, dist2.Integral());

    PiecewiseConstant2D dist3(values, 4, 2, Bounds2f(Point2f(0, 0), Point2f(4, 2)));
    EXPECT_EQ(16, dist3.Integral());

    PiecewiseConstant2D dist4(values, 4, 2, Bounds2f(Point2f(-1, 0), Point2f(0, 4)));
    EXPECT_EQ(8, dist4.Integral());
}